

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O0

int Bdc_ManDecompose(Bdc_Man_t *p,uint *puFunc,uint *puCare,int nVars,Vec_Ptr_t *vDivs,int nNodesMax
                    )

{
  int iVar1;
  abctime aVar2;
  Bdc_Fun_t *pBVar3;
  abctime aVar4;
  abctime clk;
  Bdc_Isf_t *pIsf;
  Bdc_Isf_t Isf;
  int nNodesMax_local;
  Vec_Ptr_t *vDivs_local;
  int nVars_local;
  uint *puCare_local;
  uint *puFunc_local;
  Bdc_Man_t *p_local;
  
  Isf.puOff._4_4_ = nNodesMax;
  aVar2 = Abc_Clock();
  if (p->pPars->nVarsMax < nVars) {
    __assert_fail("nVars <= p->pPars->nVarsMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                  ,0x127,
                  "int Bdc_ManDecompose(Bdc_Man_t *, unsigned int *, unsigned int *, int, Vec_Ptr_t *, int)"
                 );
  }
  p->nVars = nVars;
  iVar1 = Kit_TruthWordNum(nVars);
  p->nWords = iVar1;
  p->nNodesMax = Isf.puOff._4_4_;
  Bdc_ManPrepare(p,vDivs);
  if ((puCare != (uint *)0x0) && (iVar1 = Kit_TruthIsConst0(puCare,nVars), iVar1 != 0)) {
    pBVar3 = Bdc_Not(p->pNodes);
    p->pRoot = pBVar3;
    return 0;
  }
  Bdc_IsfStart(p,(Bdc_Isf_t *)&pIsf);
  if (puCare == (uint *)0x0) {
    Kit_TruthCopy((uint *)Isf._0_8_,puFunc,p->nVars);
    Kit_TruthNot(Isf.puOn,puFunc,p->nVars);
  }
  else {
    Kit_TruthAnd((uint *)Isf._0_8_,puCare,puFunc,p->nVars);
    Kit_TruthSharp(Isf.puOn,puCare,puFunc,p->nVars);
  }
  Bdc_SuppMinimize(p,(Bdc_Isf_t *)&pIsf);
  pBVar3 = Bdc_ManDecompose_rec(p,(Bdc_Isf_t *)&pIsf);
  p->pRoot = pBVar3;
  aVar4 = Abc_Clock();
  p->timeTotal = (aVar4 - aVar2) + p->timeTotal;
  p->numCalls = p->numCalls + 1;
  p->numNodes = p->nNodesNew + p->numNodes;
  if (p->pRoot == (Bdc_Fun_t *)0x0) {
    p_local._4_4_ = -1;
  }
  else {
    iVar1 = Bdc_ManNodeVerify(p,(Bdc_Isf_t *)&pIsf,p->pRoot);
    if (iVar1 == 0) {
      printf("Bdc_ManDecompose(): Internal verification failed.\n");
    }
    p_local._4_4_ = p->nNodesNew;
  }
  return p_local._4_4_;
}

Assistant:

int Bdc_ManDecompose( Bdc_Man_t * p, unsigned * puFunc, unsigned * puCare, int nVars, Vec_Ptr_t * vDivs, int nNodesMax )
{
    Bdc_Isf_t Isf, * pIsf = &Isf;
    abctime clk = Abc_Clock();
    assert( nVars <= p->pPars->nVarsMax );
    // set current manager parameters
    p->nVars = nVars;
    p->nWords = Kit_TruthWordNum( nVars );
    p->nNodesMax = nNodesMax;
    Bdc_ManPrepare( p, vDivs );
    if ( puCare && Kit_TruthIsConst0( puCare, nVars ) )
    {
        p->pRoot = Bdc_Not(p->pNodes);
        return 0;
    }
    // copy the function
    Bdc_IsfStart( p, pIsf );
    if ( puCare )
    {
        Kit_TruthAnd( pIsf->puOn, puCare, puFunc, p->nVars );
        Kit_TruthSharp( pIsf->puOff, puCare, puFunc, p->nVars );
    }
    else
    {
        Kit_TruthCopy( pIsf->puOn, puFunc, p->nVars );
        Kit_TruthNot( pIsf->puOff, puFunc, p->nVars );
    }
    Bdc_SuppMinimize( p, pIsf );
    // call decomposition
    p->pRoot = Bdc_ManDecompose_rec( p, pIsf );
    p->timeTotal += Abc_Clock() - clk;
    p->numCalls++;
    p->numNodes += p->nNodesNew;
    if ( p->pRoot == NULL )
        return -1;
    if ( !Bdc_ManNodeVerify( p, pIsf, p->pRoot ) )
        printf( "Bdc_ManDecompose(): Internal verification failed.\n" );
//    assert( Bdc_ManNodeVerify( p, pIsf, p->pRoot ) );
    return p->nNodesNew;
}